

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alias.cpp
# Opt level: O0

ScalarFunction * duckdb::AliasFun::GetFunction(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  ScalarFunction *in_RDI;
  ScalarFunction *fun;
  allocator_type *in_stack_fffffffffffffeb8;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffec0;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  LogicalType *local_d8;
  LogicalType local_b8 [24];
  undefined1 local_a0 [32];
  LogicalType local_80 [40];
  LogicalType *local_58;
  LogicalType local_50 [24];
  LogicalType *local_38;
  undefined8 local_30;
  undefined1 local_28 [31];
  undefined1 local_9;
  
  local_9 = 0;
  local_58 = local_50;
  duckdb::LogicalType::LogicalType(local_58,ANY);
  local_38 = local_50;
  local_30 = 1;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xd2d8a4);
  iVar1._M_len._0_4_ = in_stack_fffffffffffffed0;
  iVar1._M_array = (iterator)in_stack_fffffffffffffec8;
  iVar1._M_len._4_4_ = in_stack_fffffffffffffed4;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffec0,iVar1,in_stack_fffffffffffffeb8);
  duckdb::LogicalType::LogicalType(local_80,VARCHAR);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),in_stack_fffffffffffffec8
            );
  duckdb::LogicalType::LogicalType(local_b8,INVALID);
  duckdb::ScalarFunction::ScalarFunction(in_RDI,local_28,local_80,local_a0,0,0,0,0,local_b8,0,0,0);
  duckdb::LogicalType::~LogicalType(local_b8);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xd2d97e);
  duckdb::LogicalType::~LogicalType(local_80);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xd2d998);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xd2d9a5);
  local_d8 = (LogicalType *)&local_38;
  do {
    local_d8 = local_d8 + -0x18;
    duckdb::LogicalType::~LogicalType(local_d8);
  } while (local_d8 != local_50);
  in_RDI->field_0xa9 = 1;
  return in_RDI;
}

Assistant:

ScalarFunction AliasFun::GetFunction() {
	auto fun = ScalarFunction({LogicalType::ANY}, LogicalType::VARCHAR, AliasFunction);
	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	return fun;
}